

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.c
# Opt level: O3

int do_insmod_inner(int nargs,char **args,int opt_len)

{
  char *pcVar1;
  long lVar2;
  int iVar3;
  size_t sVar4;
  void *__ptr;
  ulong uVar5;
  char *__dest;
  undefined8 uStack_40;
  char acStack_38 [12];
  uint local_2c [2];
  uint size;
  
  uVar5 = (ulong)(opt_len + 1) + 0xf & 0xfffffffffffffff0;
  lVar2 = -uVar5;
  __dest = acStack_38 + lVar2;
  acStack_38[-uVar5] = '\0';
  if (2 < nargs) {
    pcVar1 = args[2];
    *(undefined8 *)((long)&uStack_40 + lVar2) = 0x104a61;
    strcpy(__dest,pcVar1);
    if (nargs != 3) {
      uVar5 = 3;
      do {
        *(undefined8 *)((long)&uStack_40 + lVar2) = 0x104a78;
        sVar4 = strlen(__dest);
        (__dest + sVar4)[0] = ' ';
        (__dest + sVar4)[1] = '\0';
        pcVar1 = args[uVar5];
        *(undefined8 *)((long)&uStack_40 + lVar2) = 0x104a8a;
        strcat(__dest,pcVar1);
        uVar5 = uVar5 + 1;
      } while ((uint)nargs != uVar5);
    }
  }
  pcVar1 = args[1];
  *(undefined8 *)((long)&uStack_40 + lVar2) = 0x104a9f;
  __ptr = read_file(pcVar1,local_2c);
  if (__ptr == (void *)0x0) {
    iVar3 = -1;
  }
  else {
    *(undefined8 *)((long)&uStack_40 + lVar2) = 0x104ab5;
    iVar3 = init_module(__ptr,local_2c[0],__dest);
    *(undefined8 *)((long)&uStack_40 + lVar2) = 0x104abf;
    free(__ptr);
  }
  return iVar3;
}

Assistant:

static int do_insmod_inner(int nargs, char **args, int opt_len)
{
    char options[opt_len + 1];
    int i;

    options[0] = '\0';
    if (nargs > 2) {
        strcpy(options, args[2]);
        for (i = 3; i < nargs; ++i) {
            strcat(options, " ");
            strcat(options, args[i]);
        }
    }

    return insmod(args[1], options);
}